

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O0

int create_message_sender(AMQP_MESSENGER_INSTANCE_conflict *instance)

{
  int iVar1;
  LINK_HANDLE pLVar2;
  LOGGER_LOG p_Var3;
  MESSAGE_SENDER_HANDLE pMVar4;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  AMQP_MESSENGER_INSTANCE_conflict *instance_local;
  
  pLVar2 = create_link(false,instance->session_handle,&instance->config->send_link,
                       instance->config->iothub_host_fqdn,instance->config->device_id,
                       instance->config->module_id);
  instance->sender_link = pLVar2;
  if (pLVar2 == (LINK_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"create_message_sender",0x285,1,"Failed creating the message sender link");
    }
    l._4_4_ = 0x286;
  }
  else {
    pMVar4 = messagesender_create
                       (instance->sender_link,on_message_sender_state_changed_callback,instance);
    instance->message_sender = pMVar4;
    if (pMVar4 == (MESSAGE_SENDER_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                  ,"create_message_sender",0x28a,1,
                  "Failed creating the message sender (messagesender_create failed)");
      }
      destroy_message_sender(instance);
      l._4_4_ = 0x28c;
    }
    else {
      iVar1 = messagesender_open(instance->message_sender);
      if (iVar1 == 0) {
        l._4_4_ = 0;
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                    ,"create_message_sender",0x292,1,"Failed opening the AMQP message sender.");
        }
        destroy_message_sender(instance);
        l._4_4_ = 0x294;
      }
    }
  }
  return l._4_4_;
}

Assistant:

static int create_message_sender(AMQP_MESSENGER_INSTANCE* instance)
{
    int result;

    if ((instance->sender_link = create_link(role_sender,
        instance->session_handle, &instance->config->send_link, instance->config->iothub_host_fqdn, instance->config->device_id, instance->config->module_id)) == NULL)
    {
        LogError("Failed creating the message sender link");
        result = MU_FAILURE;
    }
    else if ((instance->message_sender = messagesender_create(instance->sender_link, on_message_sender_state_changed_callback, (void*)instance)) == NULL)
    {
        LogError("Failed creating the message sender (messagesender_create failed)");
        destroy_message_sender(instance);
        result = MU_FAILURE;
    }
    else
    {
        if (messagesender_open(instance->message_sender) != RESULT_OK)
        {
            LogError("Failed opening the AMQP message sender.");
            destroy_message_sender(instance);
            result = MU_FAILURE;
        }
        else
        {
            result = RESULT_OK;
        }
    }

    return result;
}